

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

double sampleClimatePara(BiomeNoise *bn,int64_t *np,double x,double z)

{
  double dVar1;
  double dVar2;
  long in_RSI;
  float *in_RDI;
  float fVar3;
  double p;
  float d;
  int y;
  double off;
  float np_param [4];
  float w;
  float e;
  float c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  double in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Spline *in_stack_fffffffffffffff8;
  double dVar4;
  
  if (in_RDI[0x1802] == 5.60519e-45) {
    dVar4 = sampleDoublePerlin((DoublePerlinNoise *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                               ,in_stack_ffffffffffffffb0,
                               (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                              );
    dVar1 = sampleDoublePerlin((DoublePerlinNoise *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                               ,in_stack_ffffffffffffffb0,
                               (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                              );
    dVar2 = sampleDoublePerlin((DoublePerlinNoise *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                               ,in_stack_ffffffffffffffb0,
                               (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                              );
    fVar3 = getSpline(in_stack_fffffffffffffff8,in_RDI);
    fVar3 = fVar3 + 0.015 + 0.48125;
    if (in_RSI != 0) {
      *(long *)(in_RSI + 0x10) = (long)((float)dVar4 * 10000.0);
      *(long *)(in_RSI + 0x18) = (long)((float)dVar1 * 10000.0);
      *(long *)(in_RSI + 0x20) = (long)(fVar3 * 10000.0);
      *(long *)(in_RSI + 0x28) = (long)((float)dVar2 * 10000.0);
    }
    dVar4 = (double)fVar3;
  }
  else {
    dVar4 = sampleDoublePerlin((DoublePerlinNoise *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                               ,in_stack_ffffffffffffffb0,
                               (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                              );
    if (in_RSI != 0) {
      *(long *)(in_RSI + (long)(int)in_RDI[0x1802] * 8) = (long)(dVar4 * 10000.0);
    }
  }
  return dVar4;
}

Assistant:

double sampleClimatePara(const BiomeNoise *bn, int64_t *np, double x, double z)
{
    if (bn->nptype == NP_DEPTH)
    {
        float c, e, w;
        c = sampleDoublePerlin(bn->climate + NP_CONTINENTALNESS, x, 0, z);
        e = sampleDoublePerlin(bn->climate + NP_EROSION, x, 0, z);
        w = sampleDoublePerlin(bn->climate + NP_WEIRDNESS, x, 0, z);

        float np_param[] = {
            c, e, -3.0F * ( fabsf( fabsf(w) - 0.6666667F ) - 0.33333334F ), w,
        };
        double off = getSpline(bn->sp, np_param) + 0.015F;
        int y = 0;
        float d = 1.0 - (y * 4) / 128.0 - 83.0/160.0 + off;
        if (np)
        {
            np[2] = (int64_t)(10000.0F*c);
            np[3] = (int64_t)(10000.0F*e);
            np[4] = (int64_t)(10000.0F*d);
            np[5] = (int64_t)(10000.0F*w);
        }
        return d;
    }
    double p = sampleDoublePerlin(bn->climate + bn->nptype, x, 0, z);
    if (np)
        np[bn->nptype] = (int64_t)(10000.0F*p);
    return p;
}